

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

char * __thiscall Json::Value::asCString(Value *this)

{
  char *pcVar1;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  if ((char)*(ushort *)&this->field_0x8 == '\x04') {
    pcVar1 = (this->value_).string_ + (*(ushort *)&this->field_0x8 >> 6 & 4);
    if ((this->value_).string_ == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    return pcVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,"in Json::Value::asCString(): requires stringValue",0x31);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

const char* Value::asCString() const {
  JSON_ASSERT_MESSAGE(type_ == stringValue,
                      "in Json::Value::asCString(): requires stringValue");
  if (value_.string_ == 0) return 0;
  unsigned this_len;
  char const* this_str;
  decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
  return this_str;
}